

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpe_model_trainer.h
# Opt level: O2

uint64_t sentencepiece::bpe::Trainer::EncodePos(int sid,int l,int r)

{
  char *pcVar1;
  ostream *poVar2;
  Die local_1c;
  Die local_1b;
  Die local_1a;
  Die local_19;
  
  if (l < 0) {
    local_19.die_ = true;
    pcVar1 = logging::BaseName("src/bpe_model_trainer.h");
    poVar2 = std::operator<<((ostream *)&std::cerr,pcVar1);
    poVar2 = std::operator<<(poVar2,"(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x46);
    poVar2 = std::operator<<(poVar2,") [");
    poVar2 = std::operator<<(poVar2,"(l) >= (0)");
    std::operator<<(poVar2,"] ");
    error::Die::~Die(&local_19);
  }
  if (r < 0) {
    local_1a.die_ = true;
    pcVar1 = logging::BaseName("src/bpe_model_trainer.h");
    poVar2 = std::operator<<((ostream *)&std::cerr,pcVar1);
    poVar2 = std::operator<<(poVar2,"(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x47);
    poVar2 = std::operator<<(poVar2,") [");
    poVar2 = std::operator<<(poVar2,"(r) >= (0)");
    std::operator<<(poVar2,"] ");
    error::Die::~Die(&local_1a);
  }
  if (0xffff < l) {
    local_1b.die_ = true;
    pcVar1 = logging::BaseName("src/bpe_model_trainer.h");
    poVar2 = std::operator<<((ostream *)&std::cerr,pcVar1);
    poVar2 = std::operator<<(poVar2,"(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x48);
    poVar2 = std::operator<<(poVar2,") [");
    poVar2 = std::operator<<(poVar2,"(l) <= (std::numeric_limits<uint16_t>::max())");
    std::operator<<(poVar2,"] ");
    error::Die::~Die(&local_1b);
  }
  if (0xffff < r) {
    local_1c.die_ = true;
    pcVar1 = logging::BaseName("src/bpe_model_trainer.h");
    poVar2 = std::operator<<((ostream *)&std::cerr,pcVar1);
    poVar2 = std::operator<<(poVar2,"(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x49);
    poVar2 = std::operator<<(poVar2,") [");
    poVar2 = std::operator<<(poVar2,"(r) <= (std::numeric_limits<uint16_t>::max())");
    std::operator<<(poVar2,"] ");
    error::Die::~Die(&local_1c);
  }
  return (long)r | (ulong)(uint)sid << 0x20 | (long)l << 0x10;
}

Assistant:

static uint64_t EncodePos(int sid, int l, int r) {
    CHECK_GE(l, 0);
    CHECK_GE(r, 0);
    CHECK_LE(l, std::numeric_limits<uint16_t>::max());
    CHECK_LE(r, std::numeric_limits<uint16_t>::max());
    const uint64_t n = (static_cast<uint64_t>(sid) << 32) |
                       (static_cast<uint64_t>(l) << 16) | r;
    return n;
  }